

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

ListSchema capnp::ListSchema::of(Which primitiveType)

{
  uint uVar1;
  Type local_50;
  Fault local_40;
  Fault f_1;
  Fault local_28;
  Fault f;
  undefined1 auStack_18 [6];
  Which primitiveType_local;
  
  uVar1 = (uint)primitiveType;
  f.exception._6_2_ = primitiveType;
  if (0xd < uVar1) {
    if (uVar1 - 0xe < 4) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[72]>
                (&local_28,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
                 ,0x2ef,FAILED,(char *)0x0,
                 "\"Must use one of the other ListSchema::of() overloads for complex types.\"",
                 (char (*) [72])
                 "Must use one of the other ListSchema::of() overloads for complex types.");
      kj::_::Debug::Fault::fatal(&local_28);
    }
    if (uVar1 == 0x12) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
                 ,0x2f3,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
                 (char (*) [32])"List(AnyPointer) not supported.");
      kj::_::Debug::Fault::fatal(&local_40);
    }
  }
  capnp::Type::Type(&local_50,primitiveType);
  ListSchema((ListSchema *)auStack_18,local_50);
  return (ListSchema)_auStack_18;
}

Assistant:

ListSchema ListSchema::of(schema::Type::Which primitiveType) {
  switch (primitiveType) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
      break;

    case schema::Type::STRUCT:
    case schema::Type::ENUM:
    case schema::Type::INTERFACE:
    case schema::Type::LIST:
      KJ_FAIL_REQUIRE("Must use one of the other ListSchema::of() overloads for complex types.");
      break;

    case schema::Type::ANY_POINTER:
      KJ_FAIL_REQUIRE("List(AnyPointer) not supported.");
      break;
  }

  return ListSchema(primitiveType);
}